

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_generate_mlsag
              (secp256k1_context *ctx,uint8_t *ki,uint8_t *pc,uint8_t *ps,uint8_t *nonce,
              uint8_t *preimage,size_t nCols,size_t nRows,size_t index,uint8_t **sk,uint8_t *pk)

{
  undefined8 uVar1;
  int iVar2;
  long in_RCX;
  long lVar3;
  undefined8 *in_RDX;
  secp256k1_sha256 *hash;
  undefined8 *in_R8;
  undefined8 *in_R9;
  int overflow;
  size_t clen;
  size_t k;
  size_t i;
  uint8_t tmp [64];
  secp256k1_gej R;
  secp256k1_gej L;
  secp256k1_gej gej2;
  secp256k1_gej gej1;
  secp256k1_ge ge1;
  secp256k1_pubkey pubkey;
  secp256k1_scalar ss;
  secp256k1_scalar s;
  secp256k1_scalar clast;
  secp256k1_scalar zero;
  secp256k1_scalar alpha [33];
  size_t dsRows;
  secp256k1_sha256 sha256_pre;
  secp256k1_sha256 sha256_m;
  secp256k1_rfc6979_hmac_sha256 rng;
  undefined1 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff709;
  undefined1 in_stack_fffffffffffff70a;
  undefined1 in_stack_fffffffffffff70b;
  int in_stack_fffffffffffff70c;
  secp256k1_gej *in_stack_fffffffffffff710;
  uchar *in_stack_fffffffffffff718;
  secp256k1_ge *psVar4;
  secp256k1_ge *psVar5;
  secp256k1_scalar *a;
  secp256k1_sha256 *in_stack_fffffffffffff720;
  secp256k1_scalar *b;
  secp256k1_scalar *a_00;
  secp256k1_sha256 *hash_00;
  secp256k1_scalar *a_01;
  secp256k1_scalar *r;
  secp256k1_gej *a_02;
  secp256k1_ge *r_00;
  uint in_stack_fffffffffffff76c;
  secp256k1_pubkey *in_stack_fffffffffffff770;
  size_t *in_stack_fffffffffffff778;
  uchar *in_stack_fffffffffffff780;
  secp256k1_context *in_stack_fffffffffffff788;
  uchar *in_stack_fffffffffffff790;
  secp256k1_ge *in_stack_fffffffffffff798;
  size_t in_stack_fffffffffffff7c8;
  uint8_t *in_stack_fffffffffffff7d0;
  secp256k1_ge *in_stack_fffffffffffff7d8;
  secp256k1_rfc6979_hmac_sha256 *in_stack_fffffffffffff7e0;
  uchar *in_stack_fffffffffffff808;
  secp256k1_pubkey *in_stack_fffffffffffff810;
  secp256k1_context *in_stack_fffffffffffff818;
  size_t in_stack_fffffffffffff8b0;
  uchar *in_stack_fffffffffffff8b8;
  secp256k1_rfc6979_hmac_sha256 *in_stack_fffffffffffff8c0;
  secp256k1_fe *in_stack_fffffffffffff8e8;
  secp256k1_gej *in_stack_fffffffffffff8f0;
  secp256k1_gej *in_stack_fffffffffffff8f8;
  secp256k1_gej *in_stack_fffffffffffff900;
  secp256k1_scalar local_5f8;
  secp256k1_scalar local_5d8;
  secp256k1_scalar local_5b8;
  secp256k1_scalar local_598;
  secp256k1_scalar local_578 [33];
  secp256k1_ge *local_158;
  undefined1 local_150 [104];
  secp256k1_sha256 local_e8;
  undefined8 *local_38;
  undefined8 *local_30;
  long local_28;
  undefined8 *local_20;
  int local_4;
  
  local_158 = (secp256k1_ge *)(k - 1);
  if ((((tmp._8_8_ == 0) || (k < 2)) || (clen == 0)) || (0x21 < k)) {
    local_4 = 1;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    secp256k1_scalar_set_int(&local_598,0);
    uVar1 = *local_30;
    b = (secp256k1_scalar *)local_30[1];
    a_00 = (secp256k1_scalar *)local_30[2];
    hash_00 = (secp256k1_sha256 *)local_30[3];
    a_01 = (secp256k1_scalar *)*local_38;
    r = (secp256k1_scalar *)local_38[1];
    a_02 = (secp256k1_gej *)local_38[2];
    r_00 = (secp256k1_ge *)local_38[3];
    secp256k1_rfc6979_hmac_sha256_initialize
              (in_stack_fffffffffffff7e0,(uchar *)in_stack_fffffffffffff7d8,
               (size_t)in_stack_fffffffffffff7d0);
    secp256k1_sha256_initialize(&local_e8);
    secp256k1_sha256_write
              (in_stack_fffffffffffff720,in_stack_fffffffffffff718,(size_t)in_stack_fffffffffffff710
              );
    memcpy(local_150,&local_e8,0x68);
    for (psVar4 = (secp256k1_ge *)0x0; psVar5 = local_158, psVar4 < local_158;
        psVar4 = (secp256k1_ge *)((long)(psVar4->x).n + 1)) {
      do {
        secp256k1_rfc6979_hmac_sha256_generate
                  (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)in_stack_fffffffffffff720,(uchar *)psVar4,
                   (int *)in_stack_fffffffffffff710);
        in_stack_fffffffffffff70b = true;
        if (in_stack_fffffffffffff70c == 0) {
          iVar2 = secp256k1_scalar_is_zero(local_578 + (long)psVar4);
          in_stack_fffffffffffff70b = iVar2 != 0;
        }
      } while ((bool)in_stack_fffffffffffff70b != false);
      iVar2 = secp256k1_ec_pubkey_create
                        (in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                         in_stack_fffffffffffff808);
      if (iVar2 == 0) {
        return 1;
      }
      in_stack_fffffffffffff710 = (secp256k1_gej *)0x21;
      iVar2 = secp256k1_ec_pubkey_serialize
                        (in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                         in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                         in_stack_fffffffffffff76c);
      if ((iVar2 == 0) || (in_stack_fffffffffffff710 != (secp256k1_gej *)0x21)) {
        return 1;
      }
      secp256k1_sha256_write(in_stack_fffffffffffff720,(uchar *)psVar4,0x21);
      secp256k1_sha256_write
                (in_stack_fffffffffffff720,(uchar *)psVar4,(size_t)in_stack_fffffffffffff710);
      iVar2 = hash_to_curve(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                            in_stack_fffffffffffff7c8);
      if (iVar2 != 0) {
        return 1;
      }
      secp256k1_gej_set_ge
                (in_stack_fffffffffffff710,
                 (secp256k1_ge *)
                 CONCAT44(in_stack_fffffffffffff70c,
                          CONCAT13(in_stack_fffffffffffff70b,
                                   CONCAT12(in_stack_fffffffffffff70a,
                                            CONCAT11(in_stack_fffffffffffff709,
                                                     in_stack_fffffffffffff708)))));
      secp256k1_ecmult((secp256k1_ecmult_context *)zero.d[0],(secp256k1_gej *)clast.d[3],
                       (secp256k1_gej *)clast.d[2],(secp256k1_scalar *)clast.d[1],
                       (secp256k1_scalar *)clast.d[0]);
      secp256k1_ge_set_gej(r_00,a_02);
      secp256k1_eckey_pubkey_serialize
                (psVar4,(uchar *)in_stack_fffffffffffff710,
                 (size_t *)
                 CONCAT44(in_stack_fffffffffffff70c,
                          CONCAT13(in_stack_fffffffffffff70b,
                                   CONCAT12(in_stack_fffffffffffff70a,
                                            CONCAT11(in_stack_fffffffffffff709,
                                                     in_stack_fffffffffffff708)))),0);
      secp256k1_sha256_write
                (in_stack_fffffffffffff720,(uchar *)psVar4,(size_t)in_stack_fffffffffffff710);
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)in_stack_fffffffffffff720,(uchar *)psVar4,
                 (int *)in_stack_fffffffffffff710);
      if ((in_stack_fffffffffffff70c != 0) ||
         (iVar2 = secp256k1_scalar_is_zero(&local_5d8), iVar2 != 0)) {
        return 1;
      }
      secp256k1_ecmult((secp256k1_ecmult_context *)zero.d[0],(secp256k1_gej *)clast.d[3],
                       (secp256k1_gej *)clast.d[2],(secp256k1_scalar *)clast.d[1],
                       (secp256k1_scalar *)clast.d[0]);
      secp256k1_ge_set_gej(r_00,a_02);
      secp256k1_eckey_pubkey_serialize
                (psVar4,(uchar *)in_stack_fffffffffffff710,
                 (size_t *)
                 CONCAT44(in_stack_fffffffffffff70c,
                          CONCAT13(in_stack_fffffffffffff70b,
                                   CONCAT12(in_stack_fffffffffffff70a,
                                            CONCAT11(in_stack_fffffffffffff709,
                                                     in_stack_fffffffffffff708)))),0);
    }
    for (; psVar5 < k; psVar5 = (secp256k1_ge *)((long)(psVar5->x).n + 1)) {
      do {
        secp256k1_rfc6979_hmac_sha256_generate
                  (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)in_stack_fffffffffffff720,(uchar *)psVar5,
                   (int *)in_stack_fffffffffffff710);
        in_stack_fffffffffffff70a = true;
        if (in_stack_fffffffffffff70c == 0) {
          iVar2 = secp256k1_scalar_is_zero(local_578 + (long)psVar5);
          in_stack_fffffffffffff70a = iVar2 != 0;
        }
      } while ((bool)in_stack_fffffffffffff70a != false);
      iVar2 = secp256k1_ec_pubkey_create
                        (in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                         in_stack_fffffffffffff808);
      if (iVar2 == 0) {
        return 1;
      }
      in_stack_fffffffffffff710 = (secp256k1_gej *)0x21;
      iVar2 = secp256k1_ec_pubkey_serialize
                        (in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                         in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                         in_stack_fffffffffffff76c);
      if ((iVar2 == 0) || (in_stack_fffffffffffff710 != (secp256k1_gej *)0x21)) {
        return 1;
      }
      secp256k1_sha256_write(in_stack_fffffffffffff720,(uchar *)psVar5,0x21);
      secp256k1_sha256_write
                (in_stack_fffffffffffff720,(uchar *)psVar5,(size_t)in_stack_fffffffffffff710);
    }
    secp256k1_sha256_finalize(hash_00,(uchar *)a_00);
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)in_stack_fffffffffffff720,(uchar *)psVar5,
               (int *)in_stack_fffffffffffff710);
    if ((in_stack_fffffffffffff70c == 0) &&
       (iVar2 = secp256k1_scalar_is_zero(&local_5b8), iVar2 == 0)) {
      hash = (secp256k1_sha256 *)((i + 1) % clen);
      if (hash == (secp256k1_sha256 *)0x0) {
        *local_20 = uVar1;
        local_20[1] = b;
        local_20[2] = a_00;
        local_20[3] = hash_00;
      }
      while (hash != (secp256k1_sha256 *)i) {
        memcpy(&local_e8,local_150,0x68);
        for (psVar4 = (secp256k1_ge *)0x0; psVar5 = local_158, psVar4 < local_158;
            psVar4 = (secp256k1_ge *)((long)(psVar4->x).n + 1)) {
          do {
            secp256k1_rfc6979_hmac_sha256_generate
                      (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                      );
            secp256k1_scalar_set_b32
                      ((secp256k1_scalar *)hash,(uchar *)psVar4,(int *)in_stack_fffffffffffff710);
            in_stack_fffffffffffff709 = true;
            if (in_stack_fffffffffffff70c == 0) {
              iVar2 = secp256k1_scalar_is_zero(&local_5f8);
              in_stack_fffffffffffff709 = iVar2 != 0;
            }
          } while ((bool)in_stack_fffffffffffff709 != false);
          lVar3 = (long)((long)hash->s + (long)psVar4 * clen) * 0x20;
          *(undefined8 *)(local_28 + lVar3) = uVar1;
          *(secp256k1_scalar **)(local_28 + 8 + lVar3) = b;
          *(secp256k1_scalar **)(local_28 + 0x10 + lVar3) = a_00;
          *(secp256k1_sha256 **)(local_28 + 0x18 + lVar3) = hash_00;
          iVar2 = secp256k1_eckey_pubkey_parse
                            (in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                             (size_t)in_stack_fffffffffffff788);
          if (iVar2 == 0) {
            return 1;
          }
          secp256k1_gej_set_ge
                    (in_stack_fffffffffffff710,
                     (secp256k1_ge *)
                     CONCAT44(in_stack_fffffffffffff70c,
                              CONCAT13(in_stack_fffffffffffff70b,
                                       CONCAT12(in_stack_fffffffffffff70a,
                                                CONCAT11(in_stack_fffffffffffff709,
                                                         in_stack_fffffffffffff708)))));
          secp256k1_ecmult((secp256k1_ecmult_context *)zero.d[0],(secp256k1_gej *)clast.d[3],
                           (secp256k1_gej *)clast.d[2],(secp256k1_scalar *)clast.d[1],
                           (secp256k1_scalar *)clast.d[0]);
          iVar2 = hash_to_curve(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                                in_stack_fffffffffffff7c8);
          if (iVar2 != 0) {
            return 1;
          }
          secp256k1_gej_set_ge
                    (in_stack_fffffffffffff710,
                     (secp256k1_ge *)
                     CONCAT44(in_stack_fffffffffffff70c,
                              CONCAT13(in_stack_fffffffffffff70b,
                                       CONCAT12(in_stack_fffffffffffff70a,
                                                CONCAT11(in_stack_fffffffffffff709,
                                                         in_stack_fffffffffffff708)))));
          secp256k1_ecmult((secp256k1_ecmult_context *)zero.d[0],(secp256k1_gej *)clast.d[3],
                           (secp256k1_gej *)clast.d[2],(secp256k1_scalar *)clast.d[1],
                           (secp256k1_scalar *)clast.d[0]);
          iVar2 = secp256k1_eckey_pubkey_parse
                            (in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                             (size_t)in_stack_fffffffffffff788);
          if (iVar2 == 0) {
            return 1;
          }
          secp256k1_gej_set_ge
                    (in_stack_fffffffffffff710,
                     (secp256k1_ge *)
                     CONCAT44(in_stack_fffffffffffff70c,
                              CONCAT13(in_stack_fffffffffffff70b,
                                       CONCAT12(in_stack_fffffffffffff70a,
                                                CONCAT11(in_stack_fffffffffffff709,
                                                         in_stack_fffffffffffff708)))));
          secp256k1_ecmult((secp256k1_ecmult_context *)zero.d[0],(secp256k1_gej *)clast.d[3],
                           (secp256k1_gej *)clast.d[2],(secp256k1_scalar *)clast.d[1],
                           (secp256k1_scalar *)clast.d[0]);
          secp256k1_gej_add_var
                    (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
                     in_stack_fffffffffffff8e8);
          secp256k1_sha256_write(hash,(uchar *)psVar4,(size_t)in_stack_fffffffffffff710);
          secp256k1_ge_set_gej(r_00,a_02);
          secp256k1_eckey_pubkey_serialize
                    (psVar4,(uchar *)in_stack_fffffffffffff710,
                     (size_t *)
                     CONCAT44(in_stack_fffffffffffff70c,
                              CONCAT13(in_stack_fffffffffffff70b,
                                       CONCAT12(in_stack_fffffffffffff70a,
                                                CONCAT11(in_stack_fffffffffffff709,
                                                         in_stack_fffffffffffff708)))),0);
          secp256k1_sha256_write(hash,(uchar *)psVar4,(size_t)in_stack_fffffffffffff710);
          secp256k1_ge_set_gej(r_00,a_02);
          secp256k1_eckey_pubkey_serialize
                    (psVar4,(uchar *)in_stack_fffffffffffff710,
                     (size_t *)
                     CONCAT44(in_stack_fffffffffffff70c,
                              CONCAT13(in_stack_fffffffffffff70b,
                                       CONCAT12(in_stack_fffffffffffff70a,
                                                CONCAT11(in_stack_fffffffffffff709,
                                                         in_stack_fffffffffffff708)))),0);
          secp256k1_sha256_write(hash,(uchar *)psVar4,(size_t)in_stack_fffffffffffff710);
        }
        for (; psVar5 < k; psVar5 = (secp256k1_ge *)((long)(psVar5->x).n + 1)) {
          do {
            secp256k1_rfc6979_hmac_sha256_generate
                      (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                      );
            secp256k1_scalar_set_b32
                      ((secp256k1_scalar *)hash,(uchar *)psVar5,(int *)in_stack_fffffffffffff710);
            in_stack_fffffffffffff708 = true;
            if (in_stack_fffffffffffff70c == 0) {
              iVar2 = secp256k1_scalar_is_zero(&local_5f8);
              in_stack_fffffffffffff708 = iVar2 != 0;
            }
          } while ((bool)in_stack_fffffffffffff708 != false);
          lVar3 = (long)((long)hash->s + (long)psVar5 * clen) * 0x20;
          *(undefined8 *)(local_28 + lVar3) = uVar1;
          *(secp256k1_scalar **)(local_28 + 8 + lVar3) = b;
          *(secp256k1_scalar **)(local_28 + 0x10 + lVar3) = a_00;
          *(secp256k1_sha256 **)(local_28 + 0x18 + lVar3) = hash_00;
          iVar2 = secp256k1_eckey_pubkey_parse
                            (in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                             (size_t)in_stack_fffffffffffff788);
          if (iVar2 == 0) {
            return 1;
          }
          secp256k1_gej_set_ge
                    (in_stack_fffffffffffff710,
                     (secp256k1_ge *)
                     CONCAT44(in_stack_fffffffffffff70c,
                              CONCAT13(in_stack_fffffffffffff70b,
                                       CONCAT12(in_stack_fffffffffffff70a,
                                                CONCAT11(in_stack_fffffffffffff709,
                                                         in_stack_fffffffffffff708)))));
          secp256k1_ecmult((secp256k1_ecmult_context *)zero.d[0],(secp256k1_gej *)clast.d[3],
                           (secp256k1_gej *)clast.d[2],(secp256k1_scalar *)clast.d[1],
                           (secp256k1_scalar *)clast.d[0]);
          secp256k1_sha256_write(hash,(uchar *)psVar5,(size_t)in_stack_fffffffffffff710);
          secp256k1_ge_set_gej(r_00,a_02);
          secp256k1_eckey_pubkey_serialize
                    (psVar5,(uchar *)in_stack_fffffffffffff710,
                     (size_t *)
                     CONCAT44(in_stack_fffffffffffff70c,
                              CONCAT13(in_stack_fffffffffffff70b,
                                       CONCAT12(in_stack_fffffffffffff70a,
                                                CONCAT11(in_stack_fffffffffffff709,
                                                         in_stack_fffffffffffff708)))),0);
          secp256k1_sha256_write(hash,(uchar *)psVar5,(size_t)in_stack_fffffffffffff710);
        }
        secp256k1_sha256_finalize(hash_00,(uchar *)a_00);
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)hash,(uchar *)psVar5,(int *)in_stack_fffffffffffff710);
        if ((in_stack_fffffffffffff70c != 0) ||
           (iVar2 = secp256k1_scalar_is_zero(&local_5b8), iVar2 != 0)) {
          return 1;
        }
        hash = (secp256k1_sha256 *)((ulong)((long)hash->s + 1U) % clen);
        if (hash == (secp256k1_sha256 *)0x0) {
          *local_20 = uVar1;
          local_20[1] = b;
          local_20[2] = a_00;
          local_20[3] = hash_00;
        }
      }
      for (a = (secp256k1_scalar *)0x0; a < k; a = (secp256k1_scalar *)((long)a->d + 1)) {
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)hash,(uchar *)a,(int *)in_stack_fffffffffffff710);
        if ((in_stack_fffffffffffff70c != 0) ||
           (iVar2 = secp256k1_scalar_is_zero(&local_5f8), iVar2 != 0)) {
          return 1;
        }
        secp256k1_scalar_mul(r,a_01,(secp256k1_scalar *)hash_00);
        secp256k1_scalar_negate((secp256k1_scalar *)hash,a);
        secp256k1_scalar_add((secp256k1_scalar *)hash_00,a_00,b);
        secp256k1_scalar_get_b32((uchar *)(local_28 + (i + (long)a * clen) * 0x20),&local_5f8);
      }
      secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)0x119c69);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_generate_mlsag(const secp256k1_context *ctx,
    uint8_t *ki, uint8_t *pc, uint8_t *ps,
    const uint8_t *nonce, const uint8_t *preimage, size_t nCols,
    size_t nRows, size_t index, const uint8_t **sk, const uint8_t *pk)
{
    /* nRows == nInputs + 1, last row sums commitments
    */

    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_sha256 sha256_m, sha256_pre;
    size_t dsRows = nRows-1; /* TODO: pass in dsRows explicitly? */
    /* secp256k1_scalar alpha[nRows]; */
    secp256k1_scalar alpha[MLSAG_MAX_ROWS]; /* To remove MLSAG_MAX_ROWS limit, malloc 32 * nRows for alpha  */
    secp256k1_scalar zero, clast, s, ss;
    secp256k1_pubkey pubkey;
    secp256k1_ge ge1;
    secp256k1_gej gej1, gej2, L, R;
    uint8_t tmp[32 + 32];
    size_t i, k, clen;
    int overflow;

    if (!pk
        || nRows < 2
        || nCols < 1
        || nRows > MLSAG_MAX_ROWS) {
        return 1;
    }

    secp256k1_scalar_set_int(&zero, 0);

    memcpy(tmp, nonce, 32);
    memcpy(tmp+32, preimage, 32);

    /* seed the random no. generator */
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, tmp, 32 + 32);

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, preimage, 32);
    sha256_pre = sha256_m;

    for (k = 0; k < dsRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }

        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */

        if (0 != hash_to_curve(&ge1, &pk[(index + k*nCols)*33], 33)) { /* H(pk_ind[col]) */
            return 1;
        }

        secp256k1_gej_set_ge(&gej1, &ge1);
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &alpha[k], &zero);  /* gej2 = H(pk_ind[col]) * alpha[col] */

        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* H(pk_ind[col]) * alpha[col] */

        secp256k1_scalar_set_b32(&s, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&s)) {
            return 1;
        }
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &s, &zero);  /* gej2 = H(pk_ind[col]) * sk_ind[col] */
        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, &ki[k * 33], &clen, 1);
    }

    for (k = dsRows; k < nRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }
        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */
    }

    secp256k1_sha256_finalize(&sha256_m, tmp);
    secp256k1_scalar_set_b32(&clast, tmp, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&clast)) {
        return 1;
    }

    i = (index + 1) % nCols;

    if (i == 0) {
        memcpy(pc, tmp, 32); /* *pc = clast */
    }

    while (i != index) {
        sha256_m = sha256_pre; /* set to after preimage hashed */

        for (k = 0; k < dsRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss); /* L = G * ss + pk[k][i] * clast */


            /* R = H(pk[k][i]) * ss + ki[k] * clast */
            if (0 != hash_to_curve(&ge1, &pk[(i + k*nCols)*33], 33)) { /* H(pk[k][i]) */
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej1, &gej1, &ss, &zero); /* gej1 = H(pk[k][i]) * ss */

            if (!secp256k1_eckey_pubkey_parse(&ge1, &ki[k * 33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej2, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej2, &clast, &zero); /* gej2 = ki[k] * clast */

            secp256k1_gej_add_var(&R, &gej1, &gej2, NULL);  /* R =  gej1 + gej2 */

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
            secp256k1_ge_set_gej(&ge1, &R);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* R */
        }

        for (k = dsRows; k < nRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            /* L = G * ss + pk[k][i] * clast */
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
        }

        secp256k1_sha256_finalize(&sha256_m, tmp);
        secp256k1_scalar_set_b32(&clast, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&clast)) {
            return 1;
        }
        i = (i + 1) % nCols;

        if (i == 0) {
            memcpy(pc, tmp, 32); /* *pc = clast */
        }
    }


    for (k = 0; k < nRows; ++k) {
        /* ss[k][index] = alpha[k] - clast * sk[k] */

        secp256k1_scalar_set_b32(&ss, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ss)) {
            return 1;
        }
        secp256k1_scalar_mul(&s, &clast, &ss);

        secp256k1_scalar_negate(&s, &s);
        secp256k1_scalar_add(&ss, &alpha[k], &s);

        secp256k1_scalar_get_b32(&ps[(index + k*nCols)*32], &ss);
    }

    secp256k1_rfc6979_hmac_sha256_finalize(&rng);

    return 0;
}